

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void readStartOfFrame(ifstream *inFile,Header *header)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  ColorComponent *pCVar9;
  byte samplingFactor;
  ColorComponent *component;
  byte componentID;
  uint i;
  byte precision;
  uint length;
  Header *header_local;
  ifstream *inFile_local;
  
  std::operator<<((ostream *)&std::cout,"Reading SOF Marker \n");
  if (header->numComponents == '\0') {
    iVar4 = std::istream::get();
    iVar5 = std::istream::get();
    uVar1 = std::istream::get();
    if (uVar1 == '\b') {
      iVar6 = std::istream::get();
      iVar7 = std::istream::get();
      header->height = iVar6 * 0x100 + iVar7;
      iVar6 = std::istream::get();
      iVar7 = std::istream::get();
      header->width = iVar6 * 0x100 + iVar7;
      header->mcuHeight = header->height + 7 >> 3;
      header->mcuWidth = header->width + 7 >> 3;
      header->mcuHeightReal = header->mcuHeight;
      header->mcuWidthReal = header->mcuWidth;
      if ((header->height == 0) || (header->width == 0)) {
        std::operator<<((ostream *)&std::cout,"zero width or height\n");
        header->valid = false;
      }
      else {
        bVar2 = std::istream::get();
        header->numComponents = bVar2;
        if (header->numComponents == '\x04') {
          std::operator<<((ostream *)&std::cout,"not support CMYK color mode");
          header->valid = false;
        }
        else if (header->numComponents == '\0') {
          std::operator<<((ostream *)&std::cout,"number of color components must not be zero");
          header->valid = false;
        }
        else {
          for (component._4_4_ = 0; component._4_4_ < header->numComponents;
              component._4_4_ = component._4_4_ + 1) {
            component._3_1_ = std::istream::get();
            if (component._3_1_ == 0) {
              header->zeroBased = true;
            }
            if ((header->zeroBased & 1U) != 0) {
              component._3_1_ = component._3_1_ + 1;
            }
            if ((component._3_1_ == 0) || (3 < component._3_1_)) {
              poVar8 = std::operator<<((ostream *)&std::cout,"not supported componentID:");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)component._3_1_);
              std::operator<<(poVar8,'\n');
              header->valid = false;
              return;
            }
            pCVar9 = header->colorComponent + (int)(component._3_1_ - 1);
            if ((pCVar9->used & 1U) != 0) {
              std::operator<<((ostream *)&std::cout,"used color components");
              header->valid = false;
              return;
            }
            pCVar9->used = true;
            bVar3 = std::istream::get();
            pCVar9->horizontalSamplingFactor = (byte)((int)(uint)bVar3 >> 4);
            pCVar9->verticalSamplingFactor = bVar3 & 0xf;
            bVar2 = std::istream::get();
            pCVar9->quantizationTableID = bVar2;
            if (component._3_1_ == 1) {
              if ((((pCVar9->horizontalSamplingFactor != '\x01') &&
                   (pCVar9->verticalSamplingFactor != '\x02')) &&
                  (pCVar9->verticalSamplingFactor != '\x01')) &&
                 (pCVar9->horizontalSamplingFactor != '\x02')) {
                std::operator<<((ostream *)&std::cout,"only support samplingFacotor that is 1");
                header->valid = false;
                return;
              }
              if ((pCVar9->horizontalSamplingFactor == '\x02') && ((header->mcuWidth & 1) == 1)) {
                header->mcuWidthReal = header->mcuWidthReal + 1;
              }
              if ((pCVar9->verticalSamplingFactor == '\x02') && ((header->mcuHeight & 1) == 1)) {
                header->verticalSamplingFactor = header->verticalSamplingFactor + '\x01';
              }
              header->horizontalSamplingFactor = pCVar9->horizontalSamplingFactor;
              header->verticalSamplingFactor = pCVar9->verticalSamplingFactor;
            }
            else if ((pCVar9->horizontalSamplingFactor != '\x01') ||
                    (pCVar9->verticalSamplingFactor != '\x01')) {
              std::operator<<((ostream *)&std::cout,"only support samplingFacotor that is 1");
              header->valid = false;
              return;
            }
            if (3 < pCVar9->quantizationTableID) {
              std::operator<<((ostream *)&std::cout,"not valid quantization talbe id");
              header->valid = false;
              return;
            }
            if (iVar4 * 0x100 + iVar5 + -8 + (uint)header->numComponents * -3 != 0) {
              std::operator<<((ostream *)&std::cout,"not consistent length");
              header->valid = false;
              return;
            }
          }
        }
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"invalid precision :");
      poVar8 = std::operator<<(poVar8,uVar1);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      header->valid = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"Error mutiple SOFs\n");
    header->valid = false;
  }
  return;
}

Assistant:

void readStartOfFrame(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading SOF Marker \n";
	//there can be only one SOF marker per JPEG file
	
	if (header->numComponents != 0) {
		std::cout << "Error mutiple SOFs\n";
		header->valid = false;
		return;
	}

	uint length = (inFile.get() << 8) + inFile.get();
	byte precision = inFile.get();

	//只支持8位的数据
	if (precision != 8) {
		std::cout << "invalid precision :" << precision << std::endl;
		header->valid = false;
		return;
	}

	header->height = (inFile.get() << 8) + inFile.get();
	header->width = (inFile.get() << 8) + inFile.get();

	header->mcuHeight = (header->height + 7) / 8;
	header->mcuWidth = (header->width + 7) / 8;

	header->mcuHeightReal = header->mcuHeight;
	header->mcuWidthReal = header->mcuWidth;

	if (header->height == 0 || header->width == 0) {
		std::cout << "zero width or height\n";
		header->valid = false;
		return;
	}
	
	header->numComponents = inFile.get();
	if (header->numComponents == 4) {
		std::cout << "not support CMYK color mode";
		header->valid = false;
		return;
	}

	if (header->numComponents == 0) {
		std::cout << "number of color components must not be zero";
		header->valid = false;
		return;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		byte componentID = inFile.get();
		/*
			usually 1 2 3, but 0 1 2 is possible ,always force them into 1 2 3
			Y(1), 2(Cb), 3(Cr)
		*/
		if (componentID == 0) {
			header->zeroBased = true;
		}

		if (header->zeroBased) {
			componentID += 1;
		}

		if (componentID == 0 || componentID > 3) {
			std::cout << "not supported componentID:" << (uint)componentID << '\n';
			header->valid = false;
			return;
		}

		ColorComponent* component = &(header->colorComponent[componentID - 1]);
		if (component->used) {
			std::cout << "used color components";
			header->valid = false;
			return;
		}

		component->used = true;
		byte samplingFactor = inFile.get();
		component->horizontalSamplingFactor = samplingFactor >> 4;
		component->verticalSamplingFactor = samplingFactor & 0x0F;
		component->quantizationTableID = inFile.get();

		//lunimance channel
		//只支持1 或者 2
		//horizontal 2的话 代表读取y0 y1, cb cr
		//如果vertical 也2的话, 代表读取 y0 y1 y2 y3 cb cr
		if	(componentID == 1) {

			if (component->horizontalSamplingFactor != 1 && component->verticalSamplingFactor != 2 &&component->verticalSamplingFactor != 1 && component->horizontalSamplingFactor != 2) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}

			if(component->horizontalSamplingFactor == 2 && header->mcuWidth % 2 == 1) {
				header->mcuWidthReal++;
			}

			if(component->verticalSamplingFactor == 2 && header->mcuHeight % 2 == 1) {
				header->verticalSamplingFactor++;
			}

			header->horizontalSamplingFactor = component->horizontalSamplingFactor;
			header->verticalSamplingFactor = component->verticalSamplingFactor;
		} else { 
			//cb cr在一个mcu中永远是一个
			if (component->horizontalSamplingFactor != 1 || component->verticalSamplingFactor != 1) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}
		}


		if (component->quantizationTableID > 3) {
			std::cout << "not valid quantization talbe id";
			header->valid = false;
			return;
		}
		//8是length2byte 加上 1byte sample precision 2bytes的 height 2 bytes的width  1byte的components                
		if (length - 8 - (3 * header->numComponents) != 0) {
			std::cout << "not consistent length";
			header->valid = false;
			return;
		}
	}
}